

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

sockaddr * net_uv::net_tcp_getAddr(uv_tcp_t *handle)

{
  int iVar1;
  sockaddr *name;
  int32_t client_addr_length;
  
  client_addr_length = 0x38;
  name = (sockaddr *)calloc(1,0x38);
  iVar1 = uv_tcp_getpeername(handle,name,&client_addr_length);
  if (iVar1 != 0) {
    free(name);
    name = (sockaddr *)0x0;
  }
  return name;
}

Assistant:

struct sockaddr* net_tcp_getAddr(const uv_tcp_t* handle)
{

	//�еĻ��ӵ���uv_tcp_getpeername����
	//sockaddr_in client_addr;��Ϊ sockaddr_in client_addr[2];
	//https://blog.csdn.net/readyisme/article/details/28249883
	//http://msdn.microsoft.com/en-us/library/ms737524(VS.85).aspx
	//
	//The buffer size for the local and remote address must be 16 bytes more than the size of the sockaddr structure for 
	//the transport protocol in use because the addresses are written in an internal format. For example, the size of a 
	//sockaddr_in (the address structure for TCP/IP) is 16 bytes. Therefore, a buffer size of at least 32 bytes must be 
	//specified for the local and remote addresses.

	int32_t client_addr_length = sizeof(sockaddr_in6) * 2;
	struct sockaddr* client_addr = (struct sockaddr*)fc_malloc(client_addr_length);
	memset(client_addr, 0, client_addr_length);

	int32_t r = uv_tcp_getpeername(handle, client_addr, &client_addr_length);

	if (r != 0)
	{
		fc_free(client_addr);
		return NULL;
	}
	return client_addr;
}